

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int fixBoundingBox(Rtree *pRtree,RtreeNode *pNode)

{
  byte bVar1;
  byte bVar2;
  RtreeNode *pNode_00;
  int iVar3;
  RtreeCell box;
  RtreeCell cell;
  RtreeCell local_90;
  RtreeCell local_60;
  
  pNode_00 = pNode->pParent;
  if (pNode_00 != (RtreeNode *)0x0) {
    bVar1 = pNode->zData[2];
    bVar2 = pNode->zData[3];
    nodeGetCell(pRtree,pNode,0,&local_90);
    local_60.iRowid._0_4_ = 1;
    if (1 < (uint)bVar1 * 0x100 + (uint)bVar2) {
      do {
        nodeGetCell(pRtree,pNode,(uint)local_60.iRowid,&local_60);
        cellUnion(pRtree,&local_90,&local_60);
        local_60.iRowid._0_4_ = (uint)local_60.iRowid + 1;
      } while (CONCAT11(bVar1,bVar2) != (uint)local_60.iRowid);
    }
    local_90.iRowid = pNode->iNode;
    iVar3 = nodeRowidIndex(pRtree,pNode_00,local_90.iRowid,(int *)&local_60);
    if (iVar3 == 0) {
      nodeOverwriteCell(pRtree,pNode_00,&local_90,(uint)local_60.iRowid);
      iVar3 = fixBoundingBox(pRtree,pNode_00);
    }
    return iVar3;
  }
  return 0;
}

Assistant:

static int fixBoundingBox(Rtree *pRtree, RtreeNode *pNode){
  RtreeNode *pParent = pNode->pParent;
  int rc = SQLITE_OK; 
  if( pParent ){
    int ii; 
    int nCell = NCELL(pNode);
    RtreeCell box;                            /* Bounding box for pNode */
    nodeGetCell(pRtree, pNode, 0, &box);
    for(ii=1; ii<nCell; ii++){
      RtreeCell cell;
      nodeGetCell(pRtree, pNode, ii, &cell);
      cellUnion(pRtree, &box, &cell);
    }
    box.iRowid = pNode->iNode;
    rc = nodeParentIndex(pRtree, pNode, &ii);
    if( rc==SQLITE_OK ){
      nodeOverwriteCell(pRtree, pParent, &box, ii);
      rc = fixBoundingBox(pRtree, pParent);
    }
  }
  return rc;
}